

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

void __thiscall
Js::DynamicProfileInfo::CreatePolymorphicDynamicProfileCallSiteInfo
          (DynamicProfileInfo *this,FunctionBody *funcBody,ProfileId callSiteId,
          LocalFunctionId functionId,LocalFunctionId oldFunctionId,SourceId sourceId,
          SourceId oldSourceId)

{
  ushort *puVar1;
  code *pcVar2;
  bool bVar3;
  ScriptContext *pSVar4;
  Recycler *alloc;
  PolymorphicCallSiteInfo *ptr;
  PolymorphicCallSiteInfo *ptr_00;
  undefined4 *puVar5;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  data._32_8_ = this;
  pSVar4 = FunctionProxy::GetScriptContext((FunctionProxy *)funcBody);
  local_68 = (undefined1  [8])&PolymorphicCallSiteInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_4871496;
  data.filename._0_4_ = 0x335;
  alloc = Memory::Recycler::TrackAllocInfo(pSVar4->recycler,(TrackAllocData *)local_68);
  ptr = (PolymorphicCallSiteInfo *)new<Memory::Recycler>(0x28,alloc,0x51e21e);
  (ptr->next).ptr = (PolymorphicCallSiteInfo *)0x0;
  ptr->functionIds[0] = oldFunctionId;
  ptr->functionIds[1] = functionId;
  ptr->sourceIds[0] = oldSourceId;
  ptr->sourceIds[1] = sourceId;
  ptr_00 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)14,Js::PolymorphicCallSiteInfo*>
                     ((FunctionProxy *)funcBody);
  Memory::WriteBarrierPtr<Js::PolymorphicCallSiteInfo>::WriteBarrierSet(&ptr->next,ptr_00);
  ptr->functionIds[2] = 0xfffffffc;
  ptr->functionIds[3] = 0xfffffffc;
  bVar3 = CCLock::IsLocked((CCLock *)callSiteInfoCS);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x343,"(this->callSiteInfoCS.IsLocked())",
                                "this->callSiteInfoCS.IsLocked()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  puVar1 = (ushort *)(*(long *)(data._32_8_ + 8) + 2 + (ulong)callSiteId * 0x10);
  *puVar1 = *puVar1 | 0x8000;
  Memory::WriteBarrierPtr<Js::PolymorphicCallSiteInfo>::WriteBarrierSet
            ((WriteBarrierPtr<Js::PolymorphicCallSiteInfo> *)
             (*(long *)(data._32_8_ + 8) + (ulong)callSiteId * 0x10 + 8),ptr);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)14,Js::PolymorphicCallSiteInfo*>
            ((FunctionProxy *)funcBody,ptr);
  return;
}

Assistant:

void DynamicProfileInfo::CreatePolymorphicDynamicProfileCallSiteInfo(FunctionBody *funcBody, ProfileId callSiteId, Js::LocalFunctionId functionId, Js::LocalFunctionId oldFunctionId, Js::SourceId sourceId, Js::SourceId oldSourceId)
    {
        PolymorphicCallSiteInfo *localPolyCallSiteInfo = RecyclerNewStructZ(funcBody->GetScriptContext()->GetRecycler(), PolymorphicCallSiteInfo);

        Assert(maxPolymorphicInliningSize >= 2);
        localPolyCallSiteInfo->functionIds[0] = oldFunctionId;
        localPolyCallSiteInfo->functionIds[1] = functionId;
        localPolyCallSiteInfo->sourceIds[0] = oldSourceId;
        localPolyCallSiteInfo->sourceIds[1] = sourceId;
        localPolyCallSiteInfo->next = funcBody->GetPolymorphicCallSiteInfoHead();

        for (int i = 2; i < maxPolymorphicInliningSize; i++)
        {
            localPolyCallSiteInfo->functionIds[i] = CallSiteNoInfo;
        }

        Assert(this->callSiteInfoCS.IsLocked());
        callSiteInfo[callSiteId].isPolymorphic = true;
        callSiteInfo[callSiteId].u.polymorphicCallSiteInfo = localPolyCallSiteInfo;
        funcBody->SetPolymorphicCallSiteInfoHead(localPolyCallSiteInfo);
    }